

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::FboHelper::readPixels
          (FboHelper *this,int x,int y,PixelBufferAccess *dst)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  PixelBufferAccess *dst_00;
  long lVar3;
  
  dst_00 = (PixelBufferAccess *)CONCAT44(in_register_00000034,x);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])
                    (this->m_renderCtx,dst_00,CONCAT44(in_register_00000014,y));
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (this->m_numSamples != 0) {
    iVar2 = (dst_00->super_ConstPixelBufferAccess).m_size.m_data[0];
    iVar1 = (dst_00->super_ConstPixelBufferAccess).m_size.m_data[1];
    (**(code **)(lVar3 + 0x78))(0x8ca9,(this->m_resolveFramebuffer).super_ObjectWrapper.m_object);
    (**(code **)(lVar3 + 0x140))(0,0,iVar2,iVar1,0,0,iVar2,iVar1,0x4000,0x2600);
    (**(code **)(lVar3 + 0x78))(0x8ca8);
  }
  glu::readPixels(this->m_renderCtx,0,0,dst_00);
  return;
}

Assistant:

void FboHelper::readPixels (int x, int y, const tcu::PixelBufferAccess& dst)
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	const int				width	= dst.getWidth();
	const int				height	= dst.getHeight();

	if (m_numSamples != 0)
	{
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, *m_resolveFramebuffer);
		gl.blitFramebuffer(x, y, width, height, x, y, width, height, GL_COLOR_BUFFER_BIT, GL_NEAREST);
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, *m_resolveFramebuffer);
	}

	glu::readPixels(m_renderCtx, x, y, dst);
}